

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::HasProperty
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,bool *noRedecl
          ,PropertyValueInfo *info)

{
  bool bVar1;
  PropertyId PVar2;
  BOOL BVar3;
  PropertyRecord *this_00;
  ScriptContext *this_01;
  ScriptContext *scriptContext;
  uint32 indexVal;
  int i;
  PropertyValueInfo *info_local;
  bool *noRedecl_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  if (noRedecl != (bool *)0x0) {
    *noRedecl = false;
  }
  scriptContext._4_4_ = 0;
  _indexVal = info;
  info_local = (PropertyValueInfo *)noRedecl;
  noRedecl_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  while( true ) {
    if (this->propertyCount <= scriptContext._4_4_) {
      this_01 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
      bVar1 = DynamicObject::HasObjectArray(pDStack_20);
      if ((bVar1) &&
         (BVar3 = ScriptContext::IsNumericPropertyId
                            (this_01,noRedecl_local._4_4_,(uint32 *)&scriptContext), BVar3 != 0)) {
        this_local._4_4_ =
             DynamicTypeHandler::HasItem
                       (&this->super_DynamicTypeHandler,pDStack_20,(uint32)scriptContext);
      }
      else {
        this_local._4_4_ = 0;
      }
      return this_local._4_4_;
    }
    this_00 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                        (&this->descriptors[scriptContext._4_4_].Id);
    PVar2 = PropertyRecord::GetPropertyId(this_00);
    if (PVar2 == noRedecl_local._4_4_) break;
    scriptContext._4_4_ = scriptContext._4_4_ + 1;
  }
  if ((this->descriptors[scriptContext._4_4_].field_1.Attributes & 8) != 0) {
    return 0;
  }
  if ((info_local != (PropertyValueInfo *)0x0) &&
     ((this->descriptors[scriptContext._4_4_].field_1.Attributes & 0xc0) != 0)) {
    *(undefined1 *)&info_local->m_instance = 1;
  }
  if (_indexVal != (PropertyValueInfo *)0x0) {
    PropertyValueInfo::Set
              (_indexVal,&pDStack_20->super_RecyclableObject,(PropertyIndex)scriptContext._4_4_,
               this->descriptors[scriptContext._4_4_].field_1.Attributes,InlineCacheNoFlags);
  }
  return 1;
}

Assistant:

BOOL SimpleTypeHandler<size>::HasProperty(DynamicObject* instance, PropertyId propertyId, __out_opt bool *noRedecl, _Inout_opt_ PropertyValueInfo* info)
    {
        if (noRedecl != nullptr)
        {
            *noRedecl = false;
        }

        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    return false;
                }
                if (noRedecl && descriptors[i].Attributes & PropertyNoRedecl)
                {
                    *noRedecl = true;
                }

                if (info)
                {
                    PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(i), descriptors[i].Attributes);
                }
                return true;
            }
        }

        // Check numeric propertyId only if objectArray available
        uint32 indexVal;
        ScriptContext* scriptContext = instance->GetScriptContext();
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::HasItem(instance, indexVal);
        }

        return false;
    }